

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

void duckdb::DatePartFunction<duckdb::dtime_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  Vector *pVVar1;
  value_type vVar2;
  value_type vVar3;
  long *plVar4;
  UnifiedVectorFormat *pUVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ulong uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var11;
  byte bVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  reference vector;
  reference vector_00;
  long lVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  long lVar16;
  UnifiedVectorFormat *pUVar17;
  long lVar18;
  _Head_base<0UL,_unsigned_long_*,_false> _Var19;
  UnifiedVectorFormat *pUVar20;
  ulong uVar21;
  UnifiedVectorFormat *pUVar22;
  undefined8 *puVar23;
  VectorType VVar24;
  idx_t idx_in_entry;
  undefined8 *puVar25;
  ulong uVar26;
  UnifiedVectorFormat ldata;
  undefined8 local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  unsigned_long local_d0;
  long *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  long local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  UnifiedVectorFormat *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  vVar2 = *vector;
  vVar3 = *vector_00;
  VVar24 = (VectorType)result;
  if (((byte)vVar2 ^ 2) == 0 && ((byte)vVar3 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar24);
    plVar4 = *(long **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      lVar14 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                         (**(undefined8 **)(vector + 0x20),(*(undefined8 **)(vector + 0x20))[1],
                          **(undefined8 **)(vector_00 + 0x20));
      *plVar4 = lVar14;
      return;
    }
  }
  else {
    pUVar5 = *(UnifiedVectorFormat **)(args + 0x18);
    if (((byte)vVar3 ^ 2) == 0 && vVar2 == (value_type)0x0) {
      puVar23 = *(undefined8 **)(vector_00 + 0x20);
      lVar14 = *(long *)(vector + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar24);
        lVar6 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        *(UnifiedVectorFormat **)(result + 0x40) = pUVar5;
        if (*(long *)(vector + 0x28) == 0) {
          p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = 0;
          *(undefined8 *)(result + 0x38) = 0;
          local_78 = pUVar5;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          *(undefined8 *)(result + 0x28) = 0;
        }
        else {
          local_78 = pUVar5;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)(vector + 0x28),
                     (unsigned_long *)&local_78);
          p_Var13 = p_Stack_c0;
          plVar4 = local_c8;
          local_c8 = (long *)0x0;
          p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(long **)(result + 0x30) = plVar4;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var13;
          if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
             p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
          }
          pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (result + 0x30));
          _Var19._M_head_impl =
               (pTVar15->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(unsigned_long **)(result + 0x28) = _Var19._M_head_impl;
          if (_Var19._M_head_impl != (unsigned_long *)0x0) {
            if (pUVar5 + 0x3f < (UnifiedVectorFormat *)0x40) {
              return;
            }
            lVar14 = lVar14 + 8;
            pUVar22 = (UnifiedVectorFormat *)0x0;
            uVar21 = 0;
            do {
              if (*(long *)(result + 0x28) == 0) {
                pUVar17 = pUVar22 + 0x40;
                if (pUVar5 <= pUVar22 + 0x40) {
                  pUVar17 = pUVar5;
                }
LAB_005baf54:
                pUVar20 = pUVar22;
                if (pUVar22 < pUVar17) {
                  uVar9 = *puVar23;
                  puVar25 = (undefined8 *)((long)pUVar22 * 0x10 + lVar14);
                  do {
                    lVar16 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                       (puVar25[-1],*puVar25,uVar9);
                    *(long *)(lVar6 + (long)pUVar22 * 8) = lVar16;
                    pUVar22 = pUVar22 + 1;
                    puVar25 = puVar25 + 2;
                    pUVar20 = pUVar17;
                  } while (pUVar17 != pUVar22);
                }
              }
              else {
                uVar8 = *(ulong *)(*(long *)(result + 0x28) + uVar21 * 8);
                pUVar17 = pUVar22 + 0x40;
                if (pUVar5 <= pUVar22 + 0x40) {
                  pUVar17 = pUVar5;
                }
                pUVar20 = pUVar17;
                if (uVar8 != 0) {
                  if (uVar8 == 0xffffffffffffffff) goto LAB_005baf54;
                  pUVar20 = pUVar22;
                  if (pUVar22 < pUVar17) {
                    puVar25 = (undefined8 *)((long)pUVar22 * 0x10 + lVar14);
                    uVar26 = 0;
                    do {
                      if ((uVar8 >> (uVar26 & 0x3f) & 1) != 0) {
                        lVar16 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                           (puVar25[-1],*puVar25,*puVar23);
                        *(long *)((long)pUVar22 * 8 + lVar6 + uVar26 * 8) = lVar16;
                      }
                      uVar26 = uVar26 + 1;
                      puVar25 = puVar25 + 2;
                      pUVar20 = pUVar17;
                    } while ((long)pUVar17 - (long)pUVar22 != uVar26);
                  }
                }
              }
              pUVar22 = pUVar20;
              uVar21 = uVar21 + 1;
              if (uVar21 == (ulong)(pUVar5 + 0x3f) >> 6) {
                return;
              }
            } while( true );
          }
        }
        if (pUVar5 == (UnifiedVectorFormat *)0x0) {
          return;
        }
        uVar9 = *puVar23;
        puVar23 = (undefined8 *)(lVar14 + 8);
        pUVar22 = (UnifiedVectorFormat *)0x0;
        do {
          lVar14 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                             (puVar23[-1],*puVar23,uVar9);
          *(long *)(lVar6 + (long)pUVar22 * 8) = lVar14;
          pUVar22 = pUVar22 + 1;
          puVar23 = puVar23 + 2;
        } while (pUVar5 != pUVar22);
        return;
      }
    }
    else {
      if (((byte)vVar2 ^ 2) != 0 || vVar3 != (value_type)0x0) {
        if (vVar3 != (value_type)0x0 || vVar2 != (value_type)0x0) {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c8);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar5);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,pUVar5);
          duckdb::Vector::SetVectorType(VVar24);
          lVar14 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_68 == 0 && local_b8 == 0) {
            if (pUVar5 != (UnifiedVectorFormat *)0x0) {
              lVar6 = *local_c8;
              lVar16 = *(long *)local_78;
              pUVar22 = (UnifiedVectorFormat *)0x0;
              do {
                pUVar17 = pUVar22;
                if (lVar6 != 0) {
                  pUVar17 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar22 * 4);
                }
                pUVar20 = pUVar22;
                if (lVar16 != 0) {
                  pUVar20 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar16 + (long)pUVar22 * 4);
                }
                uVar10._0_4_ = p_Stack_c0[(long)pUVar17]._M_use_count;
                uVar10._4_4_ = p_Stack_c0[(long)pUVar17]._M_weak_count;
                lVar18 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                   (p_Stack_c0[(long)pUVar17]._vptr__Sp_counted_base,uVar10,
                                    *(undefined8 *)(local_70 + (long)pUVar20 * 8));
                *(long *)(lVar14 + (long)pUVar22 * 8) = lVar18;
                pUVar22 = pUVar22 + 1;
              } while (pUVar5 != pUVar22);
            }
          }
          else if (pUVar5 != (UnifiedVectorFormat *)0x0) {
            lVar6 = *local_c8;
            lVar16 = *(long *)local_78;
            pUVar22 = (UnifiedVectorFormat *)0x0;
            do {
              pUVar17 = pUVar22;
              if (lVar6 != 0) {
                pUVar17 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar22 * 4);
              }
              pUVar20 = pUVar22;
              if (lVar16 != 0) {
                pUVar20 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar16 + (long)pUVar22 * 4);
              }
              if (((local_b8 == 0) ||
                  ((*(ulong *)(local_b8 + ((ulong)pUVar17 >> 6) * 8) >> ((ulong)pUVar17 & 0x3f) & 1)
                   != 0)) &&
                 ((local_68 == 0 ||
                  ((*(ulong *)(local_68 + ((ulong)pUVar20 >> 6) * 8) >> ((ulong)pUVar20 & 0x3f) & 1)
                   != 0)))) {
                uVar9._0_4_ = p_Stack_c0[(long)pUVar17]._M_use_count;
                uVar9._4_4_ = p_Stack_c0[(long)pUVar17]._M_weak_count;
                lVar18 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                   (p_Stack_c0[(long)pUVar17]._vptr__Sp_counted_base,uVar9,
                                    *(undefined8 *)(local_70 + (long)pUVar20 * 8));
                *(long *)(lVar14 + (long)pUVar22 * 8) = lVar18;
              }
              else {
                _Var19._M_head_impl = *(unsigned_long **)(result + 0x28);
                if (_Var19._M_head_impl == (unsigned_long *)0x0) {
                  local_d0 = *(unsigned_long *)(result + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_e8,&local_d0);
                  p_Var13 = p_Stack_e0;
                  uVar9 = local_e8;
                  local_e8 = 0;
                  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
                  *(undefined8 *)(result + 0x30) = uVar9;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var13;
                  if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
                     p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
                  }
                  pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)(result + 0x30));
                  _Var19._M_head_impl =
                       (pTVar15->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)(result + 0x28) = _Var19._M_head_impl;
                }
                bVar12 = (byte)pUVar22 & 0x3f;
                _Var19._M_head_impl[(ulong)pUVar22 >> 6] =
                     _Var19._M_head_impl[(ulong)pUVar22 >> 6] &
                     (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
              }
              pUVar22 = pUVar22 + 1;
            } while (pUVar5 != pUVar22);
          }
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
          }
          if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
          }
          if (local_a8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            return;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
          return;
        }
        lVar14 = *(long *)(vector + 0x20);
        lVar6 = *(long *)(vector_00 + 0x20);
        duckdb::Vector::SetVectorType(VVar24);
        lVar16 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        pVVar1 = result + 0x28;
        FlatVector::VerifyFlatVector(vector);
        *(UnifiedVectorFormat **)(result + 0x40) = pUVar5;
        if (*(long *)(vector + 0x28) == 0) {
          p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = 0;
          *(undefined8 *)(result + 0x38) = 0;
          local_78 = pUVar5;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          *(undefined8 *)pVVar1 = 0;
        }
        else {
          local_78 = pUVar5;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)(vector + 0x28),
                     (unsigned_long *)&local_78);
          p_Var13 = p_Stack_c0;
          plVar4 = local_c8;
          local_c8 = (long *)0x0;
          p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(long **)(result + 0x30) = plVar4;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var13;
          if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
             p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
          }
          pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (result + 0x30));
          _Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar15->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          *(_Head_base<0UL,_unsigned_long_*,_false> *)pVVar1 =
               _Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            FlatVector::VerifyFlatVector(vector_00);
            duckdb::ValidityMask::Combine((ValidityMask *)pVVar1,(ulong)(vector_00 + 0x28));
            _Var19._M_head_impl = *(unsigned_long **)pVVar1;
            goto LAB_005bb712;
          }
        }
        FlatVector::VerifyFlatVector(vector_00);
        *(UnifiedVectorFormat **)(result + 0x40) = pUVar5;
        if (*(long *)(vector_00 + 0x28) == 0) {
          p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = 0;
          *(undefined8 *)(result + 0x38) = 0;
          local_78 = pUVar5;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          _Var19._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_78 = pUVar5;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)(vector_00 + 0x28),
                     (unsigned_long *)&local_78);
          p_Var13 = p_Stack_c0;
          plVar4 = local_c8;
          local_c8 = (long *)0x0;
          p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(long **)(result + 0x30) = plVar4;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var13;
          if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
             p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
          }
          pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (result + 0x30));
          _Var19._M_head_impl =
               (pTVar15->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        *(unsigned_long **)pVVar1 = _Var19._M_head_impl;
LAB_005bb712:
        if (_Var19._M_head_impl == (unsigned_long *)0x0) {
          if (pUVar5 != (UnifiedVectorFormat *)0x0) {
            puVar23 = (undefined8 *)(lVar14 + 8);
            pUVar22 = (UnifiedVectorFormat *)0x0;
            do {
              lVar14 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                 (puVar23[-1],*puVar23,*(undefined8 *)(lVar6 + (long)pUVar22 * 8));
              *(long *)(lVar16 + (long)pUVar22 * 8) = lVar14;
              pUVar22 = pUVar22 + 1;
              puVar23 = puVar23 + 2;
            } while (pUVar5 != pUVar22);
          }
        }
        else if ((UnifiedVectorFormat *)0x3f < pUVar5 + 0x3f) {
          lVar14 = lVar14 + 8;
          pUVar22 = (UnifiedVectorFormat *)0x0;
          uVar21 = 0;
          do {
            if (*(long *)pVVar1 == 0) {
              pUVar17 = pUVar22 + 0x40;
              if (pUVar5 <= pUVar22 + 0x40) {
                pUVar17 = pUVar5;
              }
LAB_005bb7fa:
              pUVar20 = pUVar22;
              if (pUVar22 < pUVar17) {
                puVar23 = (undefined8 *)((long)pUVar22 * 0x10 + lVar14);
                do {
                  lVar18 = BinaryLambdaWrapperWithNulls::
                           Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                     (puVar23[-1],*puVar23,
                                      *(undefined8 *)(lVar6 + (long)pUVar22 * 8));
                  *(long *)(lVar16 + (long)pUVar22 * 8) = lVar18;
                  pUVar22 = pUVar22 + 1;
                  puVar23 = puVar23 + 2;
                  pUVar20 = pUVar17;
                } while (pUVar17 != pUVar22);
              }
            }
            else {
              uVar8 = *(ulong *)(*(long *)pVVar1 + uVar21 * 8);
              pUVar17 = pUVar22 + 0x40;
              if (pUVar5 <= pUVar22 + 0x40) {
                pUVar17 = pUVar5;
              }
              pUVar20 = pUVar17;
              if (uVar8 != 0) {
                if (uVar8 == 0xffffffffffffffff) goto LAB_005bb7fa;
                pUVar20 = pUVar22;
                if (pUVar22 < pUVar17) {
                  puVar23 = (undefined8 *)((long)pUVar22 * 0x10 + lVar14);
                  uVar26 = 0;
                  do {
                    if ((uVar8 >> (uVar26 & 0x3f) & 1) != 0) {
                      lVar18 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                         (puVar23[-1],*puVar23,
                                          *(undefined8 *)(lVar6 + (long)pUVar22 * 8 + uVar26 * 8));
                      *(long *)(lVar16 + (long)pUVar22 * 8 + uVar26 * 8) = lVar18;
                    }
                    uVar26 = uVar26 + 1;
                    puVar23 = puVar23 + 2;
                    pUVar20 = pUVar17;
                  } while ((long)pUVar17 - (long)pUVar22 != uVar26);
                }
              }
            }
            pUVar22 = pUVar20;
            uVar21 = uVar21 + 1;
          } while (uVar21 != (ulong)(pUVar5 + 0x3f) >> 6);
        }
        return;
      }
      puVar23 = *(undefined8 **)(vector + 0x20);
      lVar14 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar24);
        lVar6 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        *(UnifiedVectorFormat **)(result + 0x40) = pUVar5;
        if (*(long *)(vector_00 + 0x28) == 0) {
          p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = 0;
          *(undefined8 *)(result + 0x38) = 0;
          local_78 = pUVar5;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          *(undefined8 *)(result + 0x28) = 0;
        }
        else {
          local_78 = pUVar5;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)(vector_00 + 0x28),
                     (unsigned_long *)&local_78);
          p_Var13 = p_Stack_c0;
          plVar4 = local_c8;
          local_c8 = (long *)0x0;
          p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(long **)(result + 0x30) = plVar4;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var13;
          if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
             p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
          }
          pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (result + 0x30));
          _Var19._M_head_impl =
               (pTVar15->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(unsigned_long **)(result + 0x28) = _Var19._M_head_impl;
          if (_Var19._M_head_impl != (unsigned_long *)0x0) {
            if (pUVar5 + 0x3f < (UnifiedVectorFormat *)0x40) {
              return;
            }
            pUVar22 = (UnifiedVectorFormat *)0x0;
            uVar21 = 0;
            do {
              if (*(long *)(result + 0x28) == 0) {
                pUVar17 = pUVar22 + 0x40;
                if (pUVar5 <= pUVar22 + 0x40) {
                  pUVar17 = pUVar5;
                }
LAB_005bb275:
                pUVar20 = pUVar22;
                if (pUVar22 < pUVar17) {
                  uVar9 = *puVar23;
                  uVar10 = puVar23[1];
                  do {
                    lVar16 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                       (uVar9,uVar10,*(undefined8 *)(lVar14 + (long)pUVar22 * 8));
                    *(long *)(lVar6 + (long)pUVar22 * 8) = lVar16;
                    pUVar22 = pUVar22 + 1;
                    pUVar20 = pUVar17;
                  } while (pUVar17 != pUVar22);
                }
              }
              else {
                uVar8 = *(ulong *)(*(long *)(result + 0x28) + uVar21 * 8);
                pUVar17 = pUVar22 + 0x40;
                if (pUVar5 <= pUVar22 + 0x40) {
                  pUVar17 = pUVar5;
                }
                pUVar20 = pUVar17;
                if (uVar8 != 0) {
                  if (uVar8 == 0xffffffffffffffff) goto LAB_005bb275;
                  pUVar20 = pUVar22;
                  if (pUVar22 < pUVar17) {
                    uVar26 = 0;
                    do {
                      if ((uVar8 >> (uVar26 & 0x3f) & 1) != 0) {
                        lVar16 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                           (*puVar23,puVar23[1],
                                            *(undefined8 *)(lVar14 + (long)pUVar22 * 8 + uVar26 * 8)
                                           );
                        *(long *)((long)pUVar22 * 8 + lVar6 + uVar26 * 8) = lVar16;
                      }
                      uVar26 = uVar26 + 1;
                      pUVar20 = pUVar17;
                    } while ((long)pUVar17 - (long)pUVar22 != uVar26);
                  }
                }
              }
              pUVar22 = pUVar20;
              uVar21 = uVar21 + 1;
              if (uVar21 == (ulong)(pUVar5 + 0x3f) >> 6) {
                return;
              }
            } while( true );
          }
        }
        if (pUVar5 == (UnifiedVectorFormat *)0x0) {
          return;
        }
        uVar9 = *puVar23;
        uVar10 = puVar23[1];
        pUVar22 = (UnifiedVectorFormat *)0x0;
        do {
          lVar16 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                             (uVar9,uVar10,*(undefined8 *)(lVar14 + (long)pUVar22 * 8));
          *(long *)(lVar6 + (long)pUVar22 * 8) = lVar16;
          pUVar22 = pUVar22 + 1;
        } while (pUVar5 != pUVar22);
        return;
      }
    }
    duckdb::Vector::SetVectorType(VVar24);
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void DatePartFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &spec_arg = args.data[0];
	auto &date_arg = args.data[1];

	BinaryExecutor::ExecuteWithNulls<string_t, T, int64_t>(
	    spec_arg, date_arg, result, args.size(), [&](string_t specifier, T date, ValidityMask &mask, idx_t idx) {
		    if (Value::IsFinite(date)) {
			    return ExtractElement<T>(GetDatePartSpecifier(specifier.GetString()), date);
		    } else {
			    mask.SetInvalid(idx);
			    return int64_t(0);
		    }
	    });
}